

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib552.c
# Opt level: O1

int my_trace(CURL *handle,curl_infotype type,char *data,size_t size,void *userp)

{
  char cVar1;
  FILE *__stream;
  char cVar2;
  ulong uVar3;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  data *config;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  
  __stream = _stderr;
  switch(type) {
  case CURLINFO_TEXT:
    curl_mfprintf(_stderr,"== Info: %s",data);
    return 0;
  case CURLINFO_HEADER_IN:
    pcVar4 = "<= Recv header";
    break;
  case CURLINFO_HEADER_OUT:
    pcVar4 = "=> Send header";
    break;
  case CURLINFO_DATA_IN:
    pcVar4 = "<= Recv data";
    break;
  case CURLINFO_DATA_OUT:
    pcVar4 = "=> Send data";
    break;
  case CURLINFO_SSL_DATA_IN:
    pcVar4 = "<= Recv SSL data";
    break;
  case CURLINFO_SSL_DATA_OUT:
    pcVar4 = "=> Send SSL data";
    break;
  default:
    goto switchD_001024bc_default;
  }
  cVar1 = *userp;
  curl_mfprintf(_stderr,"%s, %zu bytes (0x%zx)\n",pcVar4,size,size);
  if (size != 0) {
    uVar3 = 0xffffffffffffffc0;
    if (cVar1 == '\0') {
      uVar3 = 0xfffffffffffffff0;
    }
    lVar5 = 0x40;
    if (cVar1 == '\0') {
      lVar5 = 0x10;
    }
    uVar7 = 0;
    do {
      curl_mfprintf(__stream,"%04zx: ",uVar7);
      uVar6 = uVar7;
      lVar9 = lVar5;
      if (cVar1 == '\0') {
        do {
          if (uVar6 < size) {
            curl_mfprintf(__stream,"%02x ",data[uVar6]);
          }
          else {
            fputs("   ",__stream);
          }
          lVar9 = lVar9 + -1;
          uVar6 = uVar6 + 1;
        } while (lVar9 != 0);
      }
      lVar9 = 0;
      uVar6 = uVar3 ^ 0xfffffffffffffffe;
      pcVar4 = data;
      uVar8 = uVar3 ^ 0xfffffffffffffffd;
      do {
        if (size <= uVar7 + lVar9) break;
        if (cVar1 == '\0') {
          cVar2 = pcVar4[uVar7];
          if (cVar2 < ' ') {
            cVar2 = '.';
          }
          curl_mfprintf(__stream,"%c",cVar2);
        }
        else {
          if (((uVar7 + lVar9 + 1 < size) && (pcVar4[uVar7] == '\r')) && (pcVar4[uVar7 + 1] == '\n')
             ) {
            uVar7 = uVar7 - uVar6;
            break;
          }
          cVar2 = pcVar4[uVar7];
          if (cVar2 < ' ') {
            cVar2 = '.';
          }
          curl_mfprintf(__stream,"%c",cVar2);
          if (((uVar7 + lVar9 + 2 < size) && (pcVar4[uVar7 + 1] == '\r')) &&
             (pcVar4[uVar7 + 2] == '\n')) {
            uVar7 = uVar7 - uVar8;
            break;
          }
        }
        lVar9 = lVar9 + 1;
        uVar8 = uVar8 - 1;
        uVar6 = uVar6 - 1;
        pcVar4 = pcVar4 + 1;
      } while (lVar5 != lVar9);
      fputc(10,__stream);
      uVar7 = uVar7 + lVar5;
    } while (uVar7 < size);
  }
  fflush(__stream);
switchD_001024bc_default:
  return 0;
}

Assistant:

static
int my_trace(CURL *handle, curl_infotype type,
             char *data, size_t size,
             void *userp)
{
  struct data *config = (struct data *)userp;
  const char *text;
  (void)handle; /* prevent compiler warning */

  switch(type) {
  case CURLINFO_TEXT:
    fprintf(stderr, "== Info: %s", (char *)data);
    /* FALLTHROUGH */
  default: /* in case a new one is introduced to shock us */
    return 0;

  case CURLINFO_HEADER_OUT:
    text = "=> Send header";
    break;
  case CURLINFO_DATA_OUT:
    text = "=> Send data";
    break;
  case CURLINFO_SSL_DATA_OUT:
    text = "=> Send SSL data";
    break;
  case CURLINFO_HEADER_IN:
    text = "<= Recv header";
    break;
  case CURLINFO_DATA_IN:
    text = "<= Recv data";
    break;
  case CURLINFO_SSL_DATA_IN:
    text = "<= Recv SSL data";
    break;
  }

  dump(text, stderr, (unsigned char *)data, size, config->trace_ascii);
  return 0;
}